

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_summarize.cpp
# Opt level: O1

unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true> __thiscall
duckdb::Binder::BindSummarize(Binder *this,ShowRef *ref)

{
  SelectNode *pSVar1;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var2;
  pointer pcVar3;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var4;
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var5;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> *p_Var6;
  ulong uVar7;
  _Alloc_hider _Var8;
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var9;
  uint8_t scale;
  uint8_t width;
  undefined8 uVar10;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var11;
  bool bVar12;
  pointer __p;
  unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>_> this_00;
  StarExpression *this_01;
  BaseTableRef *this_02;
  pointer pBVar13;
  pointer pQVar14;
  Binder *this_03;
  type node;
  pointer pSVar15;
  reference pvVar16;
  ConstantExpression *pCVar17;
  reference pvVar18;
  _Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  _Var19;
  CastExpression *pCVar20;
  CastExpression *this_04;
  __uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_> _Var21;
  CaseExpression *this_05;
  pointer pCVar22;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> this_06;
  pointer pSVar23;
  pointer pSVar24;
  SubqueryRef *this_07;
  optional_ptr<duckdb::CommonTableExpressionInfo,_true> cte;
  long in_RDX;
  pointer *__ptr;
  long *plVar25;
  size_type __n;
  templated_unique_single_t subquery_ref;
  templated_unique_single_t basetableref;
  templated_unique_single_t select_stmt;
  templated_unique_single_t select_node;
  templated_unique_single_t subquery;
  QualifiedName table_name;
  unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> query;
  templated_unique_single_t case_expr;
  unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> query_copy;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> negate_x
  ;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  null_percentage;
  templated_unique_single_t select;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  percentage_x;
  BoundStatement plan;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  q75_children;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  q50_children;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  q25_children;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  std_children;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  avg_children;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  null_percentage_children;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  count_children;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  unique_children;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  max_children;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  min_children;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  type_children;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  name_children;
  shared_ptr<duckdb::Binder,_true> child_binder;
  duckdb local_548 [5];
  bool local_538 [16];
  Value local_528;
  CaseCheck local_4e8;
  undefined1 local_4d8 [32];
  _Alloc_hider local_4b8;
  undefined1 local_4b0 [48];
  char local_480 [16];
  _Alloc_hider local_470;
  char local_460 [16];
  _Head_base<0UL,_duckdb::QueryNode_*,_false> local_450;
  _Head_base<0UL,_duckdb::CaseExpression_*,_false> local_448;
  StarExpression *local_440;
  tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_> local_438;
  bool local_430 [16];
  _Alloc_hider local_420;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> local_418;
  undefined1 local_410 [16];
  optional_idx local_400;
  _Alloc_hider local_3f8;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_3f0;
  undefined1 local_3e8 [16];
  __uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
  local_3d8;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_3d0;
  __node_base local_3c8;
  undefined1 local_3c0 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3a0;
  __uniq_ptr_impl<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_> local_388;
  optional_ptr<duckdb::Binder,_true> local_380;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_378;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_358;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_338;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_318;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_2f8;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_2d8;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_2b8;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_298;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_278;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_258;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_238;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_218;
  undefined **local_200;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  undefined1 local_198 [32];
  undefined1 local_178 [32];
  undefined1 local_158 [16];
  undefined1 local_148 [32];
  string local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  char local_f8 [16];
  undefined1 local_e8 [32];
  undefined1 local_c8 [32];
  LogicalType local_a8;
  LogicalType local_90;
  LogicalType local_78;
  LogicalType local_60;
  LogicalType local_48;
  
  local_450._M_head_impl = (QueryNode *)0x0;
  pSVar1 = *(SelectNode **)(in_RDX + 0x88);
  local_388._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>.
  super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl =
       (tuple<duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>)
       (tuple<duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>)this;
  local_380.ptr = (Binder *)ref;
  if (pSVar1 == (SelectNode *)0x0) {
    QualifiedName::Parse((QualifiedName *)local_4b0,(string *)(in_RDX + 0x68));
    this_00._M_t.super___uniq_ptr_impl<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>_>
    ._M_t.super__Tuple_impl<0UL,_duckdb::SelectNode_*,_std::default_delete<duckdb::SelectNode>_>.
    super__Head_base<0UL,_duckdb::SelectNode_*,_false>._M_head_impl =
         (__uniq_ptr_data<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true,_true>)
         operator_new(0xf0);
    SelectNode::SelectNode
              ((SelectNode *)
               this_00._M_t.
               super___uniq_ptr_impl<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::SelectNode_*,_std::default_delete<duckdb::SelectNode>_>
               .super__Head_base<0UL,_duckdb::SelectNode_*,_false>._M_head_impl);
    local_3c0._0_8_ =
         this_00._M_t.
         super___uniq_ptr_impl<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::SelectNode_*,_std::default_delete<duckdb::SelectNode>_>.
         super__Head_base<0UL,_duckdb::SelectNode_*,_false>._M_head_impl;
    pSVar24 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
              operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                          *)local_3c0);
    this_01 = (StarExpression *)operator_new(0x110);
    p_Var6 = (_Head_base<0UL,_duckdb::ParsedExpression_*,_false> *)
             &local_528.type_.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_528.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_528.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_1_ =
         '\0';
    local_528.type_._0_8_ = p_Var6;
    StarExpression::StarExpression(this_01,(string *)&local_528);
    if ((_Head_base<0UL,_duckdb::ParsedExpression_*,_false> *)local_528.type_._0_8_ != p_Var6) {
      operator_delete((void *)local_528.type_._0_8_);
    }
    _local_548 = (TableRef *)this_01;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&pSVar24->select_list,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)local_548);
    if ((StarExpression *)_local_548 != (StarExpression *)0x0) {
      (**(code **)(*(long *)_local_548 + 8))();
    }
    this_02 = (BaseTableRef *)operator_new(0xd0);
    BaseTableRef::BaseTableRef(this_02);
    local_528.type_._0_8_ = this_02;
    pBVar13 = unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::
              operator->((unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>
                          *)&local_528);
    ::std::__cxx11::string::_M_assign((string *)&pBVar13->catalog_name);
    pBVar13 = unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::
              operator->((unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>
                          *)&local_528);
    ::std::__cxx11::string::_M_assign((string *)&pBVar13->schema_name);
    pBVar13 = unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::
              operator->((unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>
                          *)&local_528);
    ::std::__cxx11::string::_M_assign((string *)&pBVar13->table_name);
    uVar10 = local_528.type_._0_8_;
    local_528.type_._0_8_ = (ParsedExpression *)0x0;
    pSVar24 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
              operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                          *)local_3c0);
    _Var5._M_head_impl =
         (pSVar24->from_table).
         super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
         super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
    (pSVar24->from_table).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>
    ._M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
    super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = (TableRef *)uVar10;
    if (_Var5._M_head_impl != (TableRef *)0x0) {
      (**(code **)((long)(_Var5._M_head_impl)->_vptr_TableRef + 8))();
    }
    uVar10 = local_3c0._0_8_;
    _Var2._M_head_impl = local_450._M_head_impl;
    local_3c0._0_8_ = (SelectNode *)0x0;
    local_450._M_head_impl = (QueryNode *)uVar10;
    if (_Var2._M_head_impl != (QueryNode *)0x0) {
      (*(_Var2._M_head_impl)->_vptr_QueryNode[1])();
    }
    if ((ParsedExpression *)local_528.type_._0_8_ != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)local_528.type_._0_8_ + 8))();
    }
    if ((_Head_base<0UL,_duckdb::SelectNode_*,_false>)local_3c0._0_8_ !=
        (_Head_base<0UL,_duckdb::SelectNode_*,_false>)0x0) {
      (*((QueryNode *)local_3c0._0_8_)->_vptr_QueryNode[1])();
    }
    if (local_470._M_p != local_460) {
      operator_delete(local_470._M_p);
    }
    if ((char *)local_4b0._32_8_ != local_480) {
      operator_delete((void *)local_4b0._32_8_);
    }
    if ((undefined1 *)local_4b0._0_8_ != local_4b0 + 0x10) {
      operator_delete((void *)local_4b0._0_8_);
    }
  }
  else {
    *(undefined8 *)(in_RDX + 0x88) = 0;
    local_450._M_head_impl = &pSVar1->super_QueryNode;
  }
  pQVar14 = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator->
                      ((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>
                        *)&local_450);
  (*pQVar14->_vptr_QueryNode[5])(local_430 + 0x18,pQVar14);
  CreateBinder((Binder *)local_198,(local_380.ptr)->context,local_380,REGULAR_BINDER);
  this_03 = shared_ptr<duckdb::Binder,_true>::operator->
                      ((shared_ptr<duckdb::Binder,_true> *)local_198);
  node = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator*
                   ((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *)
                    &local_450);
  Bind((BoundStatement *)local_3c0,this_03,node);
  local_218.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_218.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_218.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_258.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_258.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_258.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_278.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_278.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_278.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_298.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_298.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_298.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2f8.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_318.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_318.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_318.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_338.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_338.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_338.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_358.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_358.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_358.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_378.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_378.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_378.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b8.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2b8.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2d8.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2d8.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d8.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3e8._8_8_ = operator_new(0x80);
  *(undefined1 *)(local_3e8._8_8_ + 8) = 1;
  *(long *)(local_3e8._8_8_ + 0x10) = 0;
  *(long *)(local_3e8._8_8_ + 0x18) = 0;
  *(long **)(local_3e8._8_8_ + 0x20) = (long *)(local_3e8._8_8_ + 0x50);
  *(long *)(local_3e8._8_8_ + 0x28) = 1;
  *(long *)(local_3e8._8_8_ + 0x30) = 0;
  *(long *)(local_3e8._8_8_ + 0x38) = 0;
  *(undefined4 *)(local_3e8._8_8_ + 0x40) = 0x3f800000;
  *(long *)(local_3e8._8_8_ + 0x48) = 0;
  *(long *)(local_3e8._8_8_ + 0x50) = 0;
  *(long **)(local_3e8._8_8_ + 0x58) = (long *)(local_3e8._8_8_ + 0x68);
  *(long *)(local_3e8._8_8_ + 0x60) = 0;
  *(undefined1 *)(local_3e8._8_8_ + 0x68) = 0;
  local_200 = &PTR__SelectStatement_019b1ba8;
  *(undefined ***)local_3e8._8_8_ = &PTR__SelectStatement_019b1ba8;
  *(long *)(local_3e8._8_8_ + 0x78) = 0;
  pSVar15 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
            ::operator->((unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                          *)(local_3e8 + 8));
  _Var11._M_head_impl = local_418._M_head_impl;
  local_418._M_head_impl = (QueryNode *)0x0;
  _Var2._M_head_impl =
       (pSVar15->node).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
       _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
       super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
  (pSVar15->node).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
  super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = _Var11._M_head_impl;
  if (_Var2._M_head_impl != (QueryNode *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_QueryNode + 8))();
  }
  if (local_3a0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_3a0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      plVar25 = (long *)(local_4b0 + 0x10);
      pvVar16 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                              *)&local_3a0,__n);
      local_e8._0_8_ = local_e8 + 0x10;
      pcVar3 = (pvVar16->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_e8,pcVar3,pcVar3 + pvVar16->_M_string_length);
      Value::Value(&local_528,(string *)local_e8);
      pCVar17 = (ConstantExpression *)operator_new(0x78);
      Value::Value((Value *)local_4b0,&local_528);
      ConstantExpression::ConstantExpression(pCVar17,(Value *)local_4b0);
      Value::~Value((Value *)local_4b0);
      _local_548 = (TableRef *)pCVar17;
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  *)&local_218,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)local_548);
      if ((ConstantExpression *)_local_548 != (ConstantExpression *)0x0) {
        (**(code **)(*(long *)_local_548 + 8))();
      }
      _local_548 = (TableRef *)0x0;
      Value::~Value(&local_528);
      if ((_Hash_node_base *)local_e8._0_8_ != (_Hash_node_base *)(local_e8 + 0x10)) {
        operator_delete((void *)local_e8._0_8_);
      }
      pvVar18 = vector<duckdb::LogicalType,_true>::operator[]
                          ((vector<duckdb::LogicalType,_true> *)(local_3c0 + 8),__n);
      LogicalType::ToString_abi_cxx11_((string *)local_c8,pvVar18);
      Value::Value(&local_528,(string *)local_c8);
      pCVar17 = (ConstantExpression *)operator_new(0x78);
      Value::Value((Value *)local_4b0,&local_528);
      ConstantExpression::ConstantExpression(pCVar17,(Value *)local_4b0);
      Value::~Value((Value *)local_4b0);
      _local_548 = (TableRef *)pCVar17;
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  *)&local_238,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)local_548);
      if ((ConstantExpression *)_local_548 != (ConstantExpression *)0x0) {
        (**(code **)(*(long *)_local_548 + 8))();
      }
      _local_548 = (TableRef *)0x0;
      Value::~Value(&local_528);
      if ((pointer)local_c8._0_8_ != (pointer)(local_c8 + 0x10)) {
        operator_delete((void *)local_c8._0_8_);
      }
      local_4b0._0_8_ = plVar25;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_4b0,"min","");
      pvVar16 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                              *)&local_3a0,__n);
      local_108._M_allocated_capacity = (size_type)local_f8;
      pcVar3 = (pvVar16->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_108,pcVar3,pcVar3 + pvVar16->_M_string_length);
      SummarizeCreateAggregate((duckdb *)&local_528,(string *)local_4b0,(string *)&local_108);
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  *)&local_258,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_528);
      if ((ParsedExpression *)local_528.type_._0_8_ != (ParsedExpression *)0x0) {
        (**(code **)(*(long *)local_528.type_._0_8_ + 8))();
      }
      local_528.type_._0_8_ = (ParsedExpression *)0x0;
      if ((char *)local_108._M_allocated_capacity != local_f8) {
        operator_delete((void *)local_108._M_allocated_capacity);
      }
      if ((long *)local_4b0._0_8_ != plVar25) {
        operator_delete((void *)local_4b0._0_8_);
      }
      local_4b0._0_8_ = plVar25;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_4b0,"max","");
      pvVar16 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                              *)&local_3a0,__n);
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      pcVar3 = (pvVar16->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_128,pcVar3,pcVar3 + pvVar16->_M_string_length);
      SummarizeCreateAggregate((duckdb *)&local_528,(string *)local_4b0,&local_128);
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  *)&local_278,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_528);
      if ((ParsedExpression *)local_528.type_._0_8_ != (ParsedExpression *)0x0) {
        (**(code **)(*(long *)local_528.type_._0_8_ + 8))();
      }
      local_528.type_._0_8_ = (ParsedExpression *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p);
      }
      if ((long *)local_4b0._0_8_ != plVar25) {
        operator_delete((void *)local_4b0._0_8_);
      }
      local_4b0._0_8_ = plVar25;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_4b0,"approx_count_distinct","");
      pvVar16 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                              *)&local_3a0,__n);
      local_148._0_8_ = local_148 + 0x10;
      pcVar3 = (pvVar16->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_148,pcVar3,pcVar3 + pvVar16->_M_string_length);
      SummarizeCreateAggregate((duckdb *)&local_4e8,(string *)local_4b0,(string *)local_148);
      _Var19.super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
           (_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)operator_new(0x60);
      LogicalType::LogicalType(&local_528.type_,BIGINT);
      _local_548 = (TableRef *)
                   local_4e8.when_expr.
                   super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                   ._M_t.
                   super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                   .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
      local_4e8.when_expr.
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
           (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
           (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
            )0x0;
      CastExpression::CastExpression
                ((CastExpression *)
                 _Var19.super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl,
                 &local_528.type_,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)local_548,false);
      if (_local_548 != (TableRef *)0x0) {
        (**(code **)(*(long *)_local_548 + 8))();
      }
      _local_548 = (TableRef *)0x0;
      LogicalType::~LogicalType(&local_528.type_);
      local_4d8._0_8_ = _Var19.super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl
      ;
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  *)&local_298,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)local_4d8);
      if ((tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
          local_4d8._0_8_ != (_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)0x0) {
        (*(((ParsedExpression *)local_4d8._0_8_)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      local_4d8._0_8_ =
           (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)0x0;
      local_4e8.when_expr.
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
           (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
           (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
            )0x0;
      if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
        operator_delete((void *)local_148._0_8_);
      }
      if ((long *)local_4b0._0_8_ != plVar25) {
        operator_delete((void *)local_4b0._0_8_);
      }
      pvVar18 = vector<duckdb::LogicalType,_true>::operator[]
                          ((vector<duckdb::LogicalType,_true> *)(local_3c0 + 8),__n);
      bVar12 = LogicalType::IsNumeric(pvVar18);
      if (bVar12) {
LAB_006fedec:
        local_4b0._0_8_ = plVar25;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_4b0,"avg","");
        pvVar16 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                *)&local_3a0,__n);
        local_178._16_8_ = local_158;
        pcVar3 = (pvVar16->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)(local_178 + 0x10),pcVar3,pcVar3 + pvVar16->_M_string_length);
        SummarizeCreateAggregate
                  ((duckdb *)&local_528,(string *)local_4b0,(string *)(local_178 + 0x10));
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)&local_2f8,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&local_528);
        if ((ParsedExpression *)local_528.type_._0_8_ != (ParsedExpression *)0x0) {
          (**(code **)(*(long *)local_528.type_._0_8_ + 8))();
        }
        local_528.type_._0_8_ = (ParsedExpression *)0x0;
        if ((element_type *)local_178._16_8_ != (element_type *)local_158) {
          operator_delete((void *)local_178._16_8_);
        }
        if ((long *)local_4b0._0_8_ != plVar25) {
          operator_delete((void *)local_4b0._0_8_);
        }
      }
      else {
        pvVar18 = vector<duckdb::LogicalType,_true>::operator[]
                            ((vector<duckdb::LogicalType,_true> *)(local_3c0 + 8),__n);
        bVar12 = LogicalType::IsTemporal(pvVar18);
        if (bVar12) goto LAB_006fedec;
        LogicalType::LogicalType(&local_48,SQLNULL);
        Value::Value(&local_528,&local_48);
        pCVar17 = (ConstantExpression *)operator_new(0x78);
        Value::Value((Value *)local_4b0,&local_528);
        ConstantExpression::ConstantExpression(pCVar17,(Value *)local_4b0);
        Value::~Value((Value *)local_4b0);
        _local_548 = (TableRef *)pCVar17;
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)&local_2f8,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)local_548);
        if ((ConstantExpression *)_local_548 != (ConstantExpression *)0x0) {
          (**(code **)(*(long *)_local_548 + 8))();
        }
        _local_548 = (TableRef *)0x0;
        Value::~Value(&local_528);
        LogicalType::~LogicalType(&local_48);
      }
      pvVar18 = vector<duckdb::LogicalType,_true>::operator[]
                          ((vector<duckdb::LogicalType,_true> *)(local_3c0 + 8),__n);
      bVar12 = LogicalType::IsNumeric(pvVar18);
      if (bVar12) {
        local_4b0._0_8_ = plVar25;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_4b0,"stddev","");
        pvVar16 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                *)&local_3a0,__n);
        local_198._16_8_ = local_178;
        pcVar3 = (pvVar16->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)(local_198 + 0x10),pcVar3,pcVar3 + pvVar16->_M_string_length);
        SummarizeCreateAggregate
                  ((duckdb *)&local_528,(string *)local_4b0,(string *)(local_198 + 0x10));
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)&local_318,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&local_528);
        if ((ParsedExpression *)local_528.type_._0_8_ != (ParsedExpression *)0x0) {
          (**(code **)(*(long *)local_528.type_._0_8_ + 8))();
        }
        local_528.type_._0_8_ = (ParsedExpression *)0x0;
        if ((ClientContext *)local_198._16_8_ != (ClientContext *)local_178) {
          operator_delete((void *)local_198._16_8_);
        }
        if ((long *)local_4b0._0_8_ != plVar25) {
          operator_delete((void *)local_4b0._0_8_);
        }
      }
      else {
        LogicalType::LogicalType(&local_60,SQLNULL);
        Value::Value(&local_528,&local_60);
        pCVar17 = (ConstantExpression *)operator_new(0x78);
        Value::Value((Value *)local_4b0,&local_528);
        ConstantExpression::ConstantExpression(pCVar17,(Value *)local_4b0);
        Value::~Value((Value *)local_4b0);
        _local_548 = (TableRef *)pCVar17;
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)&local_318,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)local_548);
        if ((ConstantExpression *)_local_548 != (ConstantExpression *)0x0) {
          (**(code **)(*(long *)_local_548 + 8))();
        }
        _local_548 = (TableRef *)0x0;
        Value::~Value(&local_528);
        LogicalType::~LogicalType(&local_60);
      }
      pvVar18 = vector<duckdb::LogicalType,_true>::operator[]
                          ((vector<duckdb::LogicalType,_true> *)(local_3c0 + 8),__n);
      bVar12 = LogicalType::IsNumeric(pvVar18);
      if (bVar12) {
LAB_006ff0e6:
        local_528.type_._0_8_ =
             &local_528.type_.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_528,"approx_quantile","")
        ;
        pvVar16 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                *)&local_3a0,__n);
        local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
        pcVar3 = (pvVar16->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1b8,pcVar3,pcVar3 + pvVar16->_M_string_length);
        Value::FLOAT((Value *)local_4b0,0.25);
        SummarizeCreateAggregate(local_548,(string *)&local_528,&local_1b8,(Value *)local_4b0);
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)&local_338,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)local_548);
        if (_local_548 != (TableRef *)0x0) {
          (**(code **)(*(long *)_local_548 + 8))();
        }
        _local_548 = (TableRef *)0x0;
        Value::~Value((Value *)local_4b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p);
        }
        if ((_Head_base<0UL,_duckdb::ParsedExpression_*,_false> *)local_528.type_._0_8_ !=
            (_Head_base<0UL,_duckdb::ParsedExpression_*,_false> *)
            &local_528.type_.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
          operator_delete((void *)local_528.type_._0_8_);
        }
        local_528.type_._0_8_ =
             &local_528.type_.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_528,"approx_quantile","")
        ;
        pvVar16 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                *)&local_3a0,__n);
        local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
        pcVar3 = (pvVar16->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1d8,pcVar3,pcVar3 + pvVar16->_M_string_length);
        Value::FLOAT((Value *)local_4b0,0.5);
        SummarizeCreateAggregate(local_548,(string *)&local_528,&local_1d8,(Value *)local_4b0);
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)&local_358,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)local_548);
        if (_local_548 != (TableRef *)0x0) {
          (**(code **)(*(long *)_local_548 + 8))();
        }
        _local_548 = (TableRef *)0x0;
        Value::~Value((Value *)local_4b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p);
        }
        if ((_Head_base<0UL,_duckdb::ParsedExpression_*,_false> *)local_528.type_._0_8_ !=
            (_Head_base<0UL,_duckdb::ParsedExpression_*,_false> *)
            &local_528.type_.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
          operator_delete((void *)local_528.type_._0_8_);
        }
        local_528.type_._0_8_ =
             &local_528.type_.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_528,"approx_quantile","")
        ;
        pvVar16 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                *)&local_3a0,__n);
        local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
        pcVar3 = (pvVar16->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1f8,pcVar3,pcVar3 + pvVar16->_M_string_length);
        Value::FLOAT((Value *)local_4b0,0.75);
        SummarizeCreateAggregate(local_548,(string *)&local_528,&local_1f8,(Value *)local_4b0);
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)&local_378,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)local_548);
        if (_local_548 != (TableRef *)0x0) {
          (**(code **)(*(long *)_local_548 + 8))();
        }
        _local_548 = (TableRef *)0x0;
        Value::~Value((Value *)local_4b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p);
        }
        if ((_Head_base<0UL,_duckdb::ParsedExpression_*,_false> *)local_528.type_._0_8_ !=
            (_Head_base<0UL,_duckdb::ParsedExpression_*,_false> *)
            &local_528.type_.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
          operator_delete((void *)local_528.type_._0_8_);
        }
      }
      else {
        pvVar18 = vector<duckdb::LogicalType,_true>::operator[]
                            ((vector<duckdb::LogicalType,_true> *)(local_3c0 + 8),__n);
        bVar12 = LogicalType::IsTemporal(pvVar18);
        if (bVar12) goto LAB_006ff0e6;
        LogicalType::LogicalType(&local_78,SQLNULL);
        Value::Value(&local_528,&local_78);
        pCVar17 = (ConstantExpression *)operator_new(0x78);
        Value::Value((Value *)local_4b0,&local_528);
        ConstantExpression::ConstantExpression(pCVar17,(Value *)local_4b0);
        Value::~Value((Value *)local_4b0);
        _local_548 = (TableRef *)pCVar17;
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)&local_338,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)local_548);
        if ((ConstantExpression *)_local_548 != (ConstantExpression *)0x0) {
          (**(code **)(*(long *)_local_548 + 8))();
        }
        _local_548 = (TableRef *)0x0;
        Value::~Value(&local_528);
        LogicalType::~LogicalType(&local_78);
        LogicalType::LogicalType(&local_90,SQLNULL);
        Value::Value(&local_528,&local_90);
        pCVar17 = (ConstantExpression *)operator_new(0x78);
        Value::Value((Value *)local_4b0,&local_528);
        ConstantExpression::ConstantExpression(pCVar17,(Value *)local_4b0);
        Value::~Value((Value *)local_4b0);
        _local_548 = (TableRef *)pCVar17;
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)&local_358,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)local_548);
        if ((ConstantExpression *)_local_548 != (ConstantExpression *)0x0) {
          (**(code **)(*(long *)_local_548 + 8))();
        }
        _local_548 = (TableRef *)0x0;
        Value::~Value(&local_528);
        LogicalType::~LogicalType(&local_90);
        LogicalType::LogicalType(&local_a8,SQLNULL);
        Value::Value(&local_528,&local_a8);
        pCVar17 = (ConstantExpression *)operator_new(0x78);
        Value::Value((Value *)local_4b0,&local_528);
        ConstantExpression::ConstantExpression(pCVar17,(Value *)local_4b0);
        Value::~Value((Value *)local_4b0);
        _local_548 = (TableRef *)pCVar17;
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)&local_378,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)local_548);
        if ((ConstantExpression *)_local_548 != (ConstantExpression *)0x0) {
          (**(code **)(*(long *)_local_548 + 8))();
        }
        _local_548 = (TableRef *)0x0;
        Value::~Value(&local_528);
        LogicalType::~LogicalType(&local_a8);
      }
      SummarizeCreateCountStar();
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  *)&local_2b8,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)local_4b0);
      if ((long *)local_4b0._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_4b0._0_8_ + 8))();
      }
      pvVar16 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                              *)&local_3a0,__n);
      local_440 = (StarExpression *)local_430;
      pcVar3 = (pvVar16->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_440,pcVar3,pcVar3 + pvVar16->_M_string_length);
      SummarizeCreateCountStar();
      pCVar20 = (CastExpression *)operator_new(0x60);
      LogicalType::LogicalType((LogicalType *)local_4b0,DOUBLE);
      local_528.type_.id_ = local_4d8[0];
      local_528.type_.physical_type_ = local_4d8[1];
      local_528.type_._2_6_ = local_4d8._2_6_;
      local_4d8._0_8_ =
           (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
            )0x0;
      CastExpression::CastExpression
                (pCVar20,(LogicalType *)local_4b0,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_528,false);
      if ((ParsedExpression *)local_528.type_._0_8_ != (ParsedExpression *)0x0) {
        (**(code **)(*(long *)local_528.type_._0_8_ + 8))();
      }
      local_528.type_._0_8_ = (ParsedExpression *)0x0;
      LogicalType::~LogicalType((LogicalType *)local_4b0);
      local_4b0[0x14] = 't';
      local_4b0._16_4_ = 0x6e756f63;
      local_4b0._8_8_ = (element_type *)0x5;
      local_4b0[0x15] = '\0';
      _local_548 = (TableRef *)local_538;
      if (local_440 == (StarExpression *)local_430) {
        local_538[8] = local_430[8];
        local_538[9] = local_430[9];
        local_538[10] = local_430[10];
        local_538[0xb] = local_430[0xb];
        local_538[0xc] = local_430[0xc];
        local_538[0xd] = local_430[0xd];
        local_538[0xe] = local_430[0xe];
        local_538[0xf] = local_430[0xf];
      }
      else {
        _local_548 = (TableRef *)local_440;
      }
      local_538[1] = local_430[1];
      local_538[2] = local_430[2];
      local_538[3] = local_430[3];
      local_538[4] = local_430[4];
      local_538[5] = local_430[5];
      local_538[6] = local_430[6];
      local_538[7] = local_430[7];
      local_538[0] = local_430[0];
      local_438.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            )(_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)0x0;
      local_430[0] = false;
      local_4b0._0_8_ = plVar25;
      local_440 = (StarExpression *)local_430;
      SummarizeCreateAggregate((duckdb *)&local_4e8,(string *)local_4b0,(string *)local_548);
      this_04 = (CastExpression *)operator_new(0x60);
      LogicalType::LogicalType(&local_528.type_,DOUBLE);
      local_4d8._0_8_ =
           local_4e8.when_expr.
           super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
      local_4e8.when_expr.
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
           (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
           (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
            )0x0;
      CastExpression::CastExpression
                (this_04,&local_528.type_,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)local_4d8,false);
      if ((ParsedExpression *)local_4d8._0_8_ != (ParsedExpression *)0x0) {
        (*((BaseExpression *)local_4d8._0_8_)->_vptr_BaseExpression[1])();
      }
      local_4d8._0_8_ =
           (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
            )0x0;
      LogicalType::~LogicalType(&local_528.type_);
      local_4e8.when_expr.
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
           (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
           (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
            )0x0;
      if ((StarExpression *)_local_548 != (StarExpression *)local_538) {
        operator_delete(_local_548);
      }
      plVar25 = (long *)(local_4b0 + 0x10);
      if ((long *)local_4b0._0_8_ != plVar25) {
        operator_delete((void *)local_4b0._0_8_);
      }
      local_4b0._16_2_ = 0x2f;
      local_4b0._8_8_ = &DAT_00000001;
      local_4b0._0_8_ = plVar25;
      local_3f0._M_head_impl = (ParsedExpression *)pCVar20;
      local_3c8._M_nxt = (_Hash_node_base *)this_04;
      SummarizeCreateBinaryFunction
                ((duckdb *)local_3e8,(string *)local_4b0,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_3c8,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_3f0);
      if ((CastExpression *)local_3f0._M_head_impl != (CastExpression *)0x0) {
        (*((BaseExpression *)&((local_3f0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)
          ->_vptr_BaseExpression[1])();
      }
      local_3f0._M_head_impl = (ParsedExpression *)0x0;
      if ((CastExpression *)local_3c8._M_nxt != (CastExpression *)0x0) {
        (*(((ParsedExpression *)&(local_3c8._M_nxt)->_M_nxt)->super_BaseExpression).
          _vptr_BaseExpression[1])();
      }
      local_3c8._M_nxt = (_Hash_node_base *)0x0;
      if ((long *)local_4b0._0_8_ != plVar25) {
        operator_delete((void *)local_4b0._0_8_);
      }
      local_4d8._0_8_ = (long)local_4d8 + 0x10;
      local_4d8._16_2_ = 0x2d;
      local_4d8._8_8_ = &DAT_00000001;
      Value::DOUBLE(&local_528,1.0);
      pCVar17 = (ConstantExpression *)operator_new(0x78);
      Value::Value((Value *)local_4b0,&local_528);
      ConstantExpression::ConstantExpression(pCVar17,(Value *)local_4b0);
      Value::~Value((Value *)local_4b0);
      local_400.index = local_3e8._0_8_;
      local_3e8._0_8_ = (long *)0x0;
      local_3d0._M_head_impl = (ParsedExpression *)pCVar17;
      SummarizeCreateBinaryFunction
                ((duckdb *)&local_3f8,(string *)local_4d8,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_3d0,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_400);
      if ((long *)local_400.index != (long *)0x0) {
        (**(code **)(*(long *)local_400.index + 8))();
      }
      local_400.index = 0;
      if ((ConstantExpression *)local_3d0._M_head_impl != (ConstantExpression *)0x0) {
        (*((BaseExpression *)&((local_3d0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)
          ->_vptr_BaseExpression[1])();
      }
      local_3d0._M_head_impl = (ParsedExpression *)0x0;
      Value::~Value(&local_528);
      if (local_4d8._0_8_ != (long)local_4d8 + 0x10) {
        operator_delete((void *)local_4d8._0_8_);
      }
      local_4d8._0_8_ = (long)local_4d8 + 0x10;
      local_4d8._16_2_ = 0x2a;
      local_4d8._8_8_ = &DAT_00000001;
      local_410._8_8_ = local_3f8._M_p;
      local_3f8._M_p = (pointer)0x0;
      Value::DOUBLE(&local_528,100.0);
      pCVar17 = (ConstantExpression *)operator_new(0x78);
      Value::Value((Value *)local_4b0,&local_528);
      ConstantExpression::ConstantExpression(pCVar17,(Value *)local_4b0);
      Value::~Value((Value *)local_4b0);
      local_410._0_8_ = pCVar17;
      SummarizeCreateBinaryFunction
                ((duckdb *)&local_3d8,(string *)local_4d8,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)(local_410 + 8),
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)local_410);
      if ((ConstantExpression *)local_410._0_8_ != (ConstantExpression *)0x0) {
        (**(code **)(*(long *)local_410._0_8_ + 8))();
      }
      local_410._0_8_ = 0;
      Value::~Value(&local_528);
      if ((long *)local_410._8_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_410._8_8_ + 8))();
      }
      local_410._8_8_ = 0;
      if ((ParsedExpression *)local_4d8._0_8_ != (ParsedExpression *)(local_4d8 + 0x10)) {
        operator_delete((void *)local_4d8._0_8_);
      }
      SummarizeCreateCountStar();
      Value::BIGINT(&local_528,0);
      _Var19.super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
           (_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)operator_new(0x78);
      Value::Value((Value *)local_4b0,&local_528);
      ConstantExpression::ConstantExpression
                ((ConstantExpression *)
                 _Var19.super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl,
                 (Value *)local_4b0);
      Value::~Value((Value *)local_4b0);
      _Var21._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
           (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
           operator_new(0x48);
      local_4b0._0_8_ =
           local_4e8.when_expr.
           super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
      local_4e8.when_expr.
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
           (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
           (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
            )0x0;
      local_4d8._0_8_ = _Var19.super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl
      ;
      ComparisonExpression::ComparisonExpression
                ((ComparisonExpression *)
                 _Var21._M_t.
                 super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                 .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl,
                 COMPARE_GREATERTHAN,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)local_4b0,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)local_4d8);
      if ((tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
          local_4d8._0_8_ != (_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)0x0) {
        (*(((ParsedExpression *)local_4d8._0_8_)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      local_4d8._0_8_ =
           (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            )0x0;
      if ((long *)local_4b0._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_4b0._0_8_ + 8))();
      }
      Value::~Value(&local_528);
      this_05 = (CaseExpression *)operator_new(0x58);
      CaseExpression::CaseExpression(this_05);
      local_4e8.then_expr.
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
           (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
           (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
           local_3d8._M_t.
           super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
      local_3d8._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
           (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
           (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            )0x0;
      local_4e8.when_expr.
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
           (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
           (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
           _Var21._M_t.
           super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
      local_448._M_head_impl = this_05;
      pCVar22 = unique_ptr<duckdb::CaseExpression,_std::default_delete<duckdb::CaseExpression>,_true>
                ::operator->((unique_ptr<duckdb::CaseExpression,_std::default_delete<duckdb::CaseExpression>,_true>
                              *)&local_448);
      ::std::vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>::
      emplace_back<duckdb::CaseCheck>
                (&(pCVar22->case_checks).
                  super_vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>,&local_4e8);
      LogicalType::LogicalType((LogicalType *)local_4d8,SQLNULL);
      Value::Value(&local_528,(LogicalType *)local_4d8);
      this_06._M_head_impl = (ParsedExpression *)operator_new(0x78);
      Value::Value((Value *)local_4b0,&local_528);
      ConstantExpression::ConstantExpression
                ((ConstantExpression *)this_06._M_head_impl,(Value *)local_4b0);
      Value::~Value((Value *)local_4b0);
      pCVar22 = unique_ptr<duckdb::CaseExpression,_std::default_delete<duckdb::CaseExpression>,_true>
                ::operator->((unique_ptr<duckdb::CaseExpression,_std::default_delete<duckdb::CaseExpression>,_true>
                              *)&local_448);
      _Var4._M_head_impl =
           (pCVar22->else_expr).
           super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
      (pCVar22->else_expr).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = this_06._M_head_impl;
      if (_Var4._M_head_impl != (ParsedExpression *)0x0) {
        (**(code **)(*(long *)&(_Var4._M_head_impl)->super_BaseExpression + 8))();
      }
      Value::~Value(&local_528);
      LogicalType::~LogicalType((LogicalType *)local_4d8);
      _Var8._M_p = (pointer)_local_548;
      uVar7 = (ulong)_local_548 >> 0x30;
      width = (uint8_t)uVar7;
      scale = (uint8_t)((ulong)_Var8._M_p >> 0x28);
      _local_548 = (TableRef *)_Var8._M_p;
      LogicalType::DECIMAL(width,scale);
      pCVar20 = (CastExpression *)operator_new(0x60);
      LogicalType::LogicalType((LogicalType *)local_4b0,&local_528.type_);
      local_4b8._M_p = (pointer)local_448._M_head_impl;
      local_448._M_head_impl = (CaseExpression *)0x0;
      CastExpression::CastExpression
                (pCVar20,(LogicalType *)local_4b0,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_4b8,false);
      if ((CaseExpression *)local_4b8._M_p != (CaseExpression *)0x0) {
        (**(code **)(*(long *)local_4b8._M_p + 8))();
      }
      local_4b8._M_p = (pointer)0x0;
      LogicalType::~LogicalType((LogicalType *)local_4b0);
      local_420._M_p = (pointer)pCVar20;
      LogicalType::~LogicalType(&local_528.type_);
      if (local_4e8.then_expr.
          super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
          (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)local_4e8.then_expr.
                              super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                              .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl
                    + 8))();
      }
      local_4e8.then_expr.
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
           (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
           (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
            )0x0;
      if (local_4e8.when_expr.
          super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
          (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)local_4e8.when_expr.
                              super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                              .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl
                    + 8))();
      }
      if (local_448._M_head_impl != (CaseExpression *)0x0) {
        (*((local_448._M_head_impl)->super_ParsedExpression).super_BaseExpression.
          _vptr_BaseExpression[1])();
      }
      if ((long *)local_3f8._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_3f8._M_p + 8))();
      }
      if ((long *)local_3e8._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_3e8._0_8_ + 8))();
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  *)&local_2d8,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)(local_430 + 0x10));
      if ((CastExpression *)local_420._M_p != (CastExpression *)0x0) {
        (**(code **)(*(long *)local_420._M_p + 8))();
      }
      local_420._M_p = (pointer)0x0;
      if (local_440 != (StarExpression *)local_430) {
        operator_delete(local_440);
      }
      __n = __n + 1;
    } while (__n < (ulong)((long)local_3a0.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_3a0.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  make_uniq<duckdb::SubqueryRef,duckdb::unique_ptr<duckdb::SelectStatement,std::default_delete<duckdb::SelectStatement>,true>,char_const(&)[14]>
            (local_548,
             (unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
              *)(local_3e8 + 8),(char (*) [14])"summarize_tbl");
  pSVar23 = unique_ptr<duckdb::SubqueryRef,_std::default_delete<duckdb::SubqueryRef>,_true>::
            operator->((unique_ptr<duckdb::SubqueryRef,_std::default_delete<duckdb::SubqueryRef>,_true>
                        *)local_548);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&(pSVar23->super_TableRef).column_name_alias,&local_3a0);
  _Var21._M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
       (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
       operator_new(0xf0);
  SelectNode::SelectNode
            ((SelectNode *)
             _Var21._M_t.
             super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
             .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl);
  local_4d8._0_8_ =
       _Var21._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  pSVar24 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
            operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                        *)local_4d8);
  pcVar3 = local_4b0 + 0x10;
  local_4b0._0_8_ = pcVar3;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_4b0,"column_name","");
  SummarizeWrapUnnest((duckdb *)&local_528,
                      (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                       *)&local_218,(string *)local_4b0);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
              *)&pSVar24->select_list,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)&local_528);
  if ((ParsedExpression *)local_528.type_._0_8_ != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)local_528.type_._0_8_ + 8))();
  }
  local_528.type_._0_8_ = (ParsedExpression *)0x0;
  if ((pointer)local_4b0._0_8_ != pcVar3) {
    operator_delete((void *)local_4b0._0_8_);
  }
  pSVar24 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
            operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                        *)local_4d8);
  local_4b0._0_8_ = pcVar3;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_4b0,"column_type","");
  SummarizeWrapUnnest((duckdb *)&local_528,
                      (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                       *)&local_238,(string *)local_4b0);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
              *)&pSVar24->select_list,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)&local_528);
  if ((ParsedExpression *)local_528.type_._0_8_ != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)local_528.type_._0_8_ + 8))();
  }
  local_528.type_._0_8_ = (ParsedExpression *)0x0;
  if ((pointer)local_4b0._0_8_ != pcVar3) {
    operator_delete((void *)local_4b0._0_8_);
  }
  pSVar24 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
            operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                        *)local_4d8);
  local_4b0._0_8_ = pcVar3;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_4b0,"min","");
  SummarizeWrapUnnest((duckdb *)&local_528,
                      (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                       *)&local_258,(string *)local_4b0);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
              *)&pSVar24->select_list,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)&local_528);
  if ((ParsedExpression *)local_528.type_._0_8_ != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)local_528.type_._0_8_ + 8))();
  }
  local_528.type_._0_8_ = (ParsedExpression *)0x0;
  if ((pointer)local_4b0._0_8_ != pcVar3) {
    operator_delete((void *)local_4b0._0_8_);
  }
  pSVar24 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
            operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                        *)local_4d8);
  local_4b0._0_8_ = pcVar3;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_4b0,"max","");
  SummarizeWrapUnnest((duckdb *)&local_528,
                      (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                       *)&local_278,(string *)local_4b0);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
              *)&pSVar24->select_list,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)&local_528);
  if ((ParsedExpression *)local_528.type_._0_8_ != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)local_528.type_._0_8_ + 8))();
  }
  local_528.type_._0_8_ = (ParsedExpression *)0x0;
  if ((pointer)local_4b0._0_8_ != pcVar3) {
    operator_delete((void *)local_4b0._0_8_);
  }
  pSVar24 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
            operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                        *)local_4d8);
  local_4b0._0_8_ = pcVar3;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_4b0,"approx_unique","");
  SummarizeWrapUnnest((duckdb *)&local_528,
                      (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                       *)&local_298,(string *)local_4b0);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
              *)&pSVar24->select_list,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)&local_528);
  if ((ParsedExpression *)local_528.type_._0_8_ != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)local_528.type_._0_8_ + 8))();
  }
  local_528.type_._0_8_ = (ParsedExpression *)0x0;
  if ((pointer)local_4b0._0_8_ != pcVar3) {
    operator_delete((void *)local_4b0._0_8_);
  }
  pSVar24 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
            operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                        *)local_4d8);
  local_4b0._0_8_ = pcVar3;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_4b0,"avg","");
  SummarizeWrapUnnest((duckdb *)&local_528,
                      (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                       *)&local_2f8,(string *)local_4b0);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
              *)&pSVar24->select_list,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)&local_528);
  if ((ParsedExpression *)local_528.type_._0_8_ != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)local_528.type_._0_8_ + 8))();
  }
  local_528.type_._0_8_ = (ParsedExpression *)0x0;
  if ((pointer)local_4b0._0_8_ != pcVar3) {
    operator_delete((void *)local_4b0._0_8_);
  }
  pSVar24 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
            operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                        *)local_4d8);
  local_4b0._0_8_ = pcVar3;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_4b0,"std","");
  SummarizeWrapUnnest((duckdb *)&local_528,
                      (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                       *)&local_318,(string *)local_4b0);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
              *)&pSVar24->select_list,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)&local_528);
  if ((ParsedExpression *)local_528.type_._0_8_ != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)local_528.type_._0_8_ + 8))();
  }
  local_528.type_._0_8_ = (ParsedExpression *)0x0;
  if ((pointer)local_4b0._0_8_ != pcVar3) {
    operator_delete((void *)local_4b0._0_8_);
  }
  pSVar24 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
            operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                        *)local_4d8);
  local_4b0._0_8_ = pcVar3;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_4b0,"q25","");
  SummarizeWrapUnnest((duckdb *)&local_528,
                      (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                       *)&local_338,(string *)local_4b0);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
              *)&pSVar24->select_list,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)&local_528);
  if ((ParsedExpression *)local_528.type_._0_8_ != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)local_528.type_._0_8_ + 8))();
  }
  local_528.type_._0_8_ = (ParsedExpression *)0x0;
  if ((pointer)local_4b0._0_8_ != pcVar3) {
    operator_delete((void *)local_4b0._0_8_);
  }
  pSVar24 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
            operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                        *)local_4d8);
  local_4b0._0_8_ = pcVar3;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_4b0,"q50","");
  SummarizeWrapUnnest((duckdb *)&local_528,
                      (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                       *)&local_358,(string *)local_4b0);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
              *)&pSVar24->select_list,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)&local_528);
  if ((ParsedExpression *)local_528.type_._0_8_ != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)local_528.type_._0_8_ + 8))();
  }
  local_528.type_._0_8_ = (ParsedExpression *)0x0;
  if ((pointer)local_4b0._0_8_ != pcVar3) {
    operator_delete((void *)local_4b0._0_8_);
  }
  pSVar24 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
            operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                        *)local_4d8);
  local_4b0._0_8_ = pcVar3;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_4b0,"q75","");
  SummarizeWrapUnnest((duckdb *)&local_528,
                      (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                       *)&local_378,(string *)local_4b0);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
              *)&pSVar24->select_list,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)&local_528);
  if ((ParsedExpression *)local_528.type_._0_8_ != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)local_528.type_._0_8_ + 8))();
  }
  local_528.type_._0_8_ = (ParsedExpression *)0x0;
  if ((pointer)local_4b0._0_8_ != pcVar3) {
    operator_delete((void *)local_4b0._0_8_);
  }
  pSVar24 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
            operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                        *)local_4d8);
  local_4b0._0_8_ = pcVar3;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_4b0,"count","");
  SummarizeWrapUnnest((duckdb *)&local_528,
                      (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                       *)&local_2b8,(string *)local_4b0);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
              *)&pSVar24->select_list,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)&local_528);
  if ((ParsedExpression *)local_528.type_._0_8_ != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)local_528.type_._0_8_ + 8))();
  }
  local_528.type_._0_8_ = (ParsedExpression *)0x0;
  if ((pointer)local_4b0._0_8_ != pcVar3) {
    operator_delete((void *)local_4b0._0_8_);
  }
  pSVar24 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
            operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                        *)local_4d8);
  local_4b0._0_8_ = pcVar3;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_4b0,"null_percentage","");
  SummarizeWrapUnnest((duckdb *)&local_528,
                      (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                       *)&local_2d8,(string *)local_4b0);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
              *)&pSVar24->select_list,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)&local_528);
  if ((ParsedExpression *)local_528.type_._0_8_ != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)local_528.type_._0_8_ + 8))();
  }
  local_528.type_._0_8_ = (ParsedExpression *)0x0;
  if ((pointer)local_4b0._0_8_ != pcVar3) {
    operator_delete((void *)local_4b0._0_8_);
  }
  _Var9._M_head_impl = _local_548;
  _local_548 = (TableRef *)0x0;
  pSVar24 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
            operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                        *)local_4d8);
  _Var5._M_head_impl =
       (pSVar24->from_table).
       super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
       super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
       super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
  (pSVar24->from_table).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>.
  _M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
  super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = _Var9._M_head_impl;
  if (_Var5._M_head_impl != (TableRef *)0x0) {
    (**(code **)((long)(_Var5._M_head_impl)->_vptr_TableRef + 8))();
  }
  local_4e8.when_expr.
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
       (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
       operator_new(0x80);
  uVar10 = local_4d8._0_8_;
  (((ParsedExpression *)
   local_4e8.when_expr.
   super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
   super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
   _M_t.
   super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
   .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl)->super_BaseExpression).
  type = 1;
  (((ParsedExpression *)
   local_4e8.when_expr.
   super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
   super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
   _M_t.
   super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
   .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl)->super_BaseExpression).
  alias._M_dataplus = (pointer)0x0;
  (((ParsedExpression *)
   local_4e8.when_expr.
   super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
   super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
   _M_t.
   super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
   .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl)->super_BaseExpression).
  alias._M_string_length = 0;
  (((ParsedExpression *)
   local_4e8.when_expr.
   super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
   super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
   _M_t.
   super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
   .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl)->super_BaseExpression).
  alias.field_2._M_allocated_capacity =
       (size_type)
       &(((ParsedExpression *)
         ((long)local_4e8.when_expr.
                super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                ._M_t.
                super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl + 0x38))->
        super_BaseExpression).alias._M_string_length;
  *(long *)((long)(((ParsedExpression *)
                   local_4e8.when_expr.
                   super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                   ._M_t.
                   super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                   .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl)->
                  super_BaseExpression).alias.field_2._M_local_buf + 8) = 1;
  (((ParsedExpression *)
   local_4e8.when_expr.
   super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
   super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
   _M_t.
   super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
   .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl)->super_BaseExpression).
  query_location.index = 0;
  *(long *)&((ParsedExpression *)
            ((long)local_4e8.when_expr.
                   super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                   ._M_t.
                   super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                   .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl + 0x38))->
            super_BaseExpression = 0;
  (((ParsedExpression *)
   ((long)local_4e8.when_expr.
          super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl + 0x38))->
  super_BaseExpression).type = INVALID;
  (((ParsedExpression *)
   ((long)local_4e8.when_expr.
          super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl + 0x38))->
  super_BaseExpression).expression_class = INVALID;
  *(undefined2 *)
   &(((ParsedExpression *)
     ((long)local_4e8.when_expr.
            super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl + 0x38))->
    super_BaseExpression).field_0xa = 0x3f80;
  (((ParsedExpression *)
   ((long)local_4e8.when_expr.
          super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl + 0x38))->
  super_BaseExpression).alias._M_dataplus = (pointer)0x0;
  (((ParsedExpression *)
   ((long)local_4e8.when_expr.
          super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl + 0x38))->
  super_BaseExpression).alias._M_string_length = 0;
  (((ParsedExpression *)
   ((long)local_4e8.when_expr.
          super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl + 0x38))->
  super_BaseExpression).alias.field_2._M_allocated_capacity =
       (size_type)
       &(((ParsedExpression *)
         ((long)local_4e8.when_expr.
                super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                ._M_t.
                super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl + 0x38))->
        super_BaseExpression).query_location;
  *(long *)((long)(((ParsedExpression *)
                   ((long)local_4e8.when_expr.
                          super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                          .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl +
                   0x38))->super_BaseExpression).alias.field_2._M_local_buf + 8) = 0;
  *(undefined1 *)
   &(((ParsedExpression *)
     ((long)local_4e8.when_expr.
            super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl + 0x38))->
    super_BaseExpression).query_location.index = 0;
  (((ParsedExpression *)
   local_4e8.when_expr.
   super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
   super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
   _M_t.
   super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
   .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl)->super_BaseExpression).
  _vptr_BaseExpression = local_200;
  (((ParsedExpression *)
   ((long)local_4e8.when_expr.
          super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl + 0x70))->
  super_BaseExpression).type = INVALID;
  (((ParsedExpression *)
   ((long)local_4e8.when_expr.
          super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl + 0x70))->
  super_BaseExpression).expression_class = INVALID;
  *(undefined6 *)
   &(((ParsedExpression *)
     ((long)local_4e8.when_expr.
            super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl + 0x70))->
    super_BaseExpression).field_0xa = 0;
  local_4d8._0_8_ =
       (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
        )0x0;
  pSVar15 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
            ::operator->((unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                          *)&local_4e8);
  _Var2._M_head_impl =
       (pSVar15->node).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
       _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
       super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
  (pSVar15->node).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
  super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)uVar10;
  if (_Var2._M_head_impl != (QueryNode *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_QueryNode + 8))();
  }
  this_07 = (SubqueryRef *)operator_new(0x70);
  local_528.type_._0_8_ =
       local_4e8.when_expr.
       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  local_4e8.when_expr.
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
       (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
       (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
        )0x0;
  local_4b0._8_8_ = (element_type *)0x0;
  local_4b0._16_4_ = local_4b0._16_4_ & 0xffffff00;
  local_4b0._0_8_ = pcVar3;
  SubqueryRef::SubqueryRef
            (this_07,(unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                      *)&local_528,(string *)local_4b0);
  local_4b8._M_p = (pointer)this_07;
  if ((pointer)local_4b0._0_8_ != pcVar3) {
    operator_delete((void *)local_4b0._0_8_);
  }
  if ((ParsedExpression *)local_528.type_._0_8_ != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)local_528.type_._0_8_ + 8))();
  }
  cte.ptr = (CommonTableExpressionInfo *)
            unique_ptr<duckdb::SubqueryRef,_std::default_delete<duckdb::SubqueryRef>,_true>::
            operator*((unique_ptr<duckdb::SubqueryRef,_std::default_delete<duckdb::SubqueryRef>,_true>
                       *)&local_4b8);
  Bind((Binder *)
       local_388._M_t.
       super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>.
       super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl,
       (SubqueryRef *)local_380.ptr,cte);
  if ((SubqueryRef *)local_4b8._M_p != (SubqueryRef *)0x0) {
    (**(code **)(*(long *)local_4b8._M_p + 8))();
  }
  if (local_4e8.when_expr.
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_4e8.when_expr.
                          super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                          .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl + 8
                ))();
  }
  if ((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
      local_4d8._0_8_ != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)local_4d8._0_8_ + 8))();
  }
  if (_local_548 != (TableRef *)0x0) {
    (**(code **)(*(long *)_local_548 + 8))();
  }
  if ((long *)local_3e8._8_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_3e8._8_8_ + 8))();
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ::~vector(&local_2d8);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ::~vector(&local_2b8);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ::~vector(&local_378);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ::~vector(&local_358);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ::~vector(&local_338);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ::~vector(&local_318);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ::~vector(&local_2f8);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ::~vector(&local_298);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ::~vector(&local_278);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ::~vector(&local_258);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ::~vector(&local_238);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ::~vector(&local_218);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_3a0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)(local_3c0 + 8));
  if ((SelectNode *)local_3c0._0_8_ != (SelectNode *)0x0) {
    (**(code **)(*(long *)local_3c0._0_8_ + 8))();
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_);
  }
  if (local_418._M_head_impl != (QueryNode *)0x0) {
    (**(code **)(*(long *)local_418._M_head_impl + 8))();
  }
  if ((SelectNode *)local_450._M_head_impl != (SelectNode *)0x0) {
    (*((QueryNode *)&(local_450._M_head_impl)->_vptr_QueryNode)->_vptr_QueryNode[1])();
  }
  return (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>)
         (_Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>)
         local_388._M_t.
         super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>
         .super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<BoundTableRef> Binder::BindSummarize(ShowRef &ref) {
	unique_ptr<QueryNode> query;
	if (ref.query) {
		query = std::move(ref.query);
	} else {
		auto table_name = QualifiedName::Parse(ref.table_name);
		auto node = make_uniq<SelectNode>();
		node->select_list.push_back(make_uniq<StarExpression>());
		auto basetableref = make_uniq<BaseTableRef>();
		basetableref->catalog_name = table_name.catalog;
		basetableref->schema_name = table_name.schema;
		basetableref->table_name = table_name.name;
		node->from_table = std::move(basetableref);
		query = std::move(node);
	}
	auto query_copy = query->Copy();

	// we bind the plan once in a child-node to figure out the column names and column types
	auto child_binder = Binder::CreateBinder(context, this);
	auto plan = child_binder->Bind(*query);
	D_ASSERT(plan.types.size() == plan.names.size());
	vector<unique_ptr<ParsedExpression>> name_children;
	vector<unique_ptr<ParsedExpression>> type_children;
	vector<unique_ptr<ParsedExpression>> min_children;
	vector<unique_ptr<ParsedExpression>> max_children;
	vector<unique_ptr<ParsedExpression>> unique_children;
	vector<unique_ptr<ParsedExpression>> avg_children;
	vector<unique_ptr<ParsedExpression>> std_children;
	vector<unique_ptr<ParsedExpression>> q25_children;
	vector<unique_ptr<ParsedExpression>> q50_children;
	vector<unique_ptr<ParsedExpression>> q75_children;
	vector<unique_ptr<ParsedExpression>> count_children;
	vector<unique_ptr<ParsedExpression>> null_percentage_children;
	auto select = make_uniq<SelectStatement>();
	select->node = std::move(query_copy);
	for (idx_t i = 0; i < plan.names.size(); i++) {
		name_children.push_back(make_uniq<ConstantExpression>(Value(plan.names[i])));
		type_children.push_back(make_uniq<ConstantExpression>(Value(plan.types[i].ToString())));
		min_children.push_back(SummarizeCreateAggregate("min", plan.names[i]));
		max_children.push_back(SummarizeCreateAggregate("max", plan.names[i]));
		unique_children.push_back(make_uniq<CastExpression>(
		    LogicalType::BIGINT, SummarizeCreateAggregate("approx_count_distinct", plan.names[i])));
		if (plan.types[i].IsNumeric() || plan.types[i].IsTemporal()) {
			avg_children.push_back(SummarizeCreateAggregate("avg", plan.names[i]));
		} else {
			avg_children.push_back(make_uniq<ConstantExpression>(Value()));
		}
		if (plan.types[i].IsNumeric()) {
			std_children.push_back(SummarizeCreateAggregate("stddev", plan.names[i]));
		} else {
			std_children.push_back(make_uniq<ConstantExpression>(Value()));
		}
		if (plan.types[i].IsNumeric() || plan.types[i].IsTemporal()) {
			q25_children.push_back(SummarizeCreateAggregate("approx_quantile", plan.names[i], Value::FLOAT(0.25)));
			q50_children.push_back(SummarizeCreateAggregate("approx_quantile", plan.names[i], Value::FLOAT(0.50)));
			q75_children.push_back(SummarizeCreateAggregate("approx_quantile", plan.names[i], Value::FLOAT(0.75)));
		} else {
			q25_children.push_back(make_uniq<ConstantExpression>(Value()));
			q50_children.push_back(make_uniq<ConstantExpression>(Value()));
			q75_children.push_back(make_uniq<ConstantExpression>(Value()));
		}
		count_children.push_back(SummarizeCreateCountStar());
		null_percentage_children.push_back(SummarizeCreateNullPercentage(plan.names[i]));
	}
	auto subquery_ref = make_uniq<SubqueryRef>(std::move(select), "summarize_tbl");
	subquery_ref->column_name_alias = plan.names;

	auto select_node = make_uniq<SelectNode>();
	select_node->select_list.push_back(SummarizeWrapUnnest(name_children, "column_name"));
	select_node->select_list.push_back(SummarizeWrapUnnest(type_children, "column_type"));
	select_node->select_list.push_back(SummarizeWrapUnnest(min_children, "min"));
	select_node->select_list.push_back(SummarizeWrapUnnest(max_children, "max"));
	select_node->select_list.push_back(SummarizeWrapUnnest(unique_children, "approx_unique"));
	select_node->select_list.push_back(SummarizeWrapUnnest(avg_children, "avg"));
	select_node->select_list.push_back(SummarizeWrapUnnest(std_children, "std"));
	select_node->select_list.push_back(SummarizeWrapUnnest(q25_children, "q25"));
	select_node->select_list.push_back(SummarizeWrapUnnest(q50_children, "q50"));
	select_node->select_list.push_back(SummarizeWrapUnnest(q75_children, "q75"));
	select_node->select_list.push_back(SummarizeWrapUnnest(count_children, "count"));
	select_node->select_list.push_back(SummarizeWrapUnnest(null_percentage_children, "null_percentage"));
	select_node->from_table = std::move(subquery_ref);

	auto select_stmt = make_uniq<SelectStatement>();
	select_stmt->node = std::move(select_node);
	auto subquery = make_uniq<SubqueryRef>(std::move(select_stmt));
	return Bind(*subquery);
}